

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigResimulate(Ivy_FraigMan_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  Ivy_FraigAssignDist1(p,p->pPatWords);
  Ivy_FraigSimulateOne(p);
  if ((p->pParams->fPatScores != 0) && (0 < p->nSimWords)) {
    uVar1 = p->nSimWords * 0x20;
    uVar3 = 1;
    if (1 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    memset(p->pPatScores,0,uVar3 << 2);
  }
  iVar2 = Ivy_FraigRefineClasses(p);
  if (p->pManFraig->pData == (void *)0x0) {
    if (iVar2 < 1) {
      puts("Error: A counter-example did not refine classes!");
      __assert_fail("nChanges >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x6e4,"void Ivy_FraigResimulate(Ivy_FraigMan_t *)");
    }
    if (p->pParams->fPatScores != 0) {
      while (iVar2 = Ivy_FraigSelectBestPat(p), p->pParams->MaxScore < iVar2) {
        Ivy_FraigAssignDist1(p,p->pPatWords);
        Ivy_FraigSimulateOne(p);
        if (0 < p->nSimWords) {
          uVar1 = p->nSimWords * 0x20;
          uVar3 = (ulong)uVar1;
          if ((int)uVar1 < 2) {
            uVar3 = 1;
          }
          memset(p->pPatScores,0,uVar3 << 2);
        }
        iVar2 = Ivy_FraigRefineClasses(p);
        if (p->pManFraig->pData != (void *)0x0) {
          return;
        }
        if (iVar2 == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigResimulate( Ivy_FraigMan_t * p )
{
    int nChanges;
    Ivy_FraigAssignDist1( p, p->pPatWords );
    Ivy_FraigSimulateOne( p );
    if ( p->pParams->fPatScores )
        Ivy_FraigCleanPatScores( p );
    nChanges = Ivy_FraigRefineClasses( p );
    if ( p->pManFraig->pData )
        return;
    if ( nChanges < 1 )
        printf( "Error: A counter-example did not refine classes!\n" );
    assert( nChanges >= 1 );
//printf( "Refined classes! = %5d.   Changes = %4d.\n", p->lClasses.nItems, nChanges );
    if ( !p->pParams->fPatScores )
        return;

    // perform additional simulation using dist1 patterns derived from successful patterns
    while ( Ivy_FraigSelectBestPat(p) > p->pParams->MaxScore )
    {
        Ivy_FraigAssignDist1( p, p->pPatWords );
        Ivy_FraigSimulateOne( p );
        Ivy_FraigCleanPatScores( p );
        nChanges = Ivy_FraigRefineClasses( p );
        if ( p->pManFraig->pData )
            return;
//printf( "Refined class!!! = %5d.   Changes = %4d.   Pairs = %6d.\n", p->lClasses.nItems, nChanges, Ivy_FraigCountPairsClasses(p) );
        if ( nChanges == 0 )
            break;
    }
}